

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_helper.cpp
# Opt level: O2

void duckdb::ExtensionHelper::AutoLoadExtension(DatabaseInstance *db,string *extension_name)

{
  bool bVar1;
  int iVar2;
  DBConfig *pDVar3;
  type pFVar4;
  Logger *this;
  DBConfigOptions *options;
  _Head_base<0UL,_duckdb::FileSystem_*,_false> local_100;
  unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  local_f8;
  string repository_url;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined2 local_a8;
  bool local_a6;
  ExtensionRepository autoinstall_repo;
  
  bVar1 = DatabaseInstance::ExtensionIsLoaded(db,extension_name);
  if (!bVar1) {
    pDVar3 = DBConfig::GetConfig(db);
    FileSystem::CreateLocal();
    if ((pDVar3->options).autoinstall_known_extensions == true) {
      GetAutoInstallExtensionsRepository_abi_cxx11_
                (&repository_url,(duckdb *)&pDVar3->options,options);
      ExtensionRepository::GetRepositoryByUrl(&autoinstall_repo,&repository_url);
      local_c8._M_p = (pointer)&local_b8;
      local_c0 = 0;
      local_b8._M_local_buf[0] = '\0';
      local_a8._0_1_ = false;
      local_a8._1_1_ = false;
      local_a6 = false;
      local_d0 = (undefined1  [8])&autoinstall_repo;
      pFVar4 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
               operator*((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                          *)&local_100);
      InstallExtension((ExtensionHelper *)&local_f8,db,pFVar4,extension_name,
                       (ExtensionInstallOptions *)local_d0);
      ::std::
      unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>::
      ~unique_ptr(&local_f8);
      ::std::__cxx11::string::~string((string *)&local_c8);
      ExtensionRepository::~ExtensionRepository(&autoinstall_repo);
      ::std::__cxx11::string::~string((string *)&repository_url);
    }
    pFVar4 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
             operator*((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                        *)&local_100);
    LoadExternalExtension(db,pFVar4,extension_name);
    this = Logger::Get(db);
    iVar2 = (*this->_vptr_Logger[2])(this,"duckdb.Extensions.ExtensionAutoloaded",0x1e);
    if ((char)iVar2 != '\0') {
      Logger::WriteLog(this,"duckdb.Extensions.ExtensionAutoloaded",LOG_INFO,extension_name);
    }
    if (local_100._M_head_impl != (FileSystem *)0x0) {
      (*(local_100._M_head_impl)->_vptr_FileSystem[1])();
    }
  }
  return;
}

Assistant:

void ExtensionHelper::AutoLoadExtension(DatabaseInstance &db, const string &extension_name) {
	if (db.ExtensionIsLoaded(extension_name)) {
		// Avoid downloading again
		return;
	}
	auto &dbconfig = DBConfig::GetConfig(db);
	try {
		auto fs = FileSystem::CreateLocal();
#ifndef DUCKDB_WASM
		if (dbconfig.options.autoinstall_known_extensions) {
			auto repository_url = GetAutoInstallExtensionsRepository(dbconfig.options);
			auto autoinstall_repo = ExtensionRepository::GetRepositoryByUrl(repository_url);
			ExtensionInstallOptions options;
			options.repository = autoinstall_repo;
			ExtensionHelper::InstallExtension(db, *fs, extension_name, options);
		}
#endif
		ExtensionHelper::LoadExternalExtension(db, *fs, extension_name);
		DUCKDB_LOG_INFO(db, "duckdb.Extensions.ExtensionAutoloaded", extension_name);

	} catch (std::exception &e) {
		ErrorData error(e);
		throw AutoloadException(extension_name, error.RawMessage());
	}
}